

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O3

UBool u_isWhitespace_63(UChar32 c)

{
  uint uVar1;
  ulong uVar2;
  
  if ((uint)c < 0xd800) {
    uVar1 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar1 = ((uint)c >> 5) + 0x140;
    if (0xdbff < (uint)c) {
      uVar1 = (uint)c >> 5;
    }
  }
  else {
    uVar2 = 0x11f4;
    if (0x10ffff < (uint)c) goto LAB_0032d63d;
    uVar1 = ((uint)c >> 5 & 0x3f) + (uint)propsTrie_index[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar2 = (ulong)((c & 0x1fU) + (uint)propsTrie_index[uVar1] * 4);
LAB_0032d63d:
  if ((1 << ((byte)propsTrie_index[uVar2] & 0x1f) & 0x7000U) == 0) {
    if (c - 9U < 0x17) {
      return c - 0x1cU < 0xfffffff2;
    }
  }
  else if (((c != 0xa0) && (c != 0x202f)) && (c != 0x2007)) {
    return '\x01';
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
u_isWhitespace(UChar32 c) {
    uint32_t props;
    GET_PROPS(c, props);
    return (UBool)(
                ((CAT_MASK(props)&U_GC_Z_MASK)!=0 &&
                    c!=NBSP && c!=FIGURESP && c!=NNBSP) || /* exclude no-break spaces */
                IS_THAT_ASCII_CONTROL_SPACE(c)
           );
}